

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Limiter.h
# Opt level: O3

void __thiscall Limiter::Limiter(Limiter *this,int maxRPS,int timeFramesPS)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->mutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->hitQueue_).hitsPerTimeFrame_,(long)timeFramesPS,
             (allocator_type *)local_50._M_pod_data);
  (this->hitQueue_).activeHitsSum_ = 0;
  (this->hitQueue_).windowBegin_ = 0;
  (this->hitQueue_).windowEnd_ = timeFramesPS + -1;
  if (2 < timeFramesPS + 1U) {
    timeFramesPS = 0;
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/4sily[P]rate-limiter-cpp/Limiter.h:28:57)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  Tick::Tick(&this->tick_,(microseconds)((long)timeFramesPS * 1000000),
             (function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  this->maxRPS_ = maxRPS;
  return;
}

Assistant:

Limiter(int maxRPS, int timeFramesPS)
        : hitQueue_(timeFramesPS)
        // note that callbacks may start coming right after this
        , tick_(std::chrono::seconds(1) / timeFramesPS, [this] { OnTimeFrameBoundary(); })
        , maxRPS_(maxRPS)
    {
    }